

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O0

clock_updates_list_t * __thiscall
tchecker::clock_updates_map_t::operator[](clock_updates_map_t *this,clock_id_t x)

{
  size_type sVar1;
  invalid_argument *this_00;
  reference pvVar2;
  clock_id_t x_local;
  clock_updates_map_t *this_local;
  
  sVar1 = std::
          vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
          size(&this->_map);
  if (sVar1 <= x) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"out-of-range clock identifier");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::
           vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
           operator[](&this->_map,(ulong)x);
  return pvVar2;
}

Assistant:

tchecker::clock_updates_list_t & clock_updates_map_t::operator[](tchecker::clock_id_t x)
{
  if (x >= _map.size())
    throw std::invalid_argument("out-of-range clock identifier");
  return _map[x];
}